

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypto_helper.c
# Opt level: O2

void helper_crypto_sm4e_arm(void *vd,void *vn)

{
  ulong uVar1;
  uint uVar2;
  uint uVar3;
  undefined8 local_28;
  undefined8 uStack_20;
  undefined8 local_18;
  undefined8 uStack_10;
  
  local_28 = *vd;
  uStack_20 = *(undefined8 *)((long)vd + 8);
  local_18 = *vn;
  uStack_10 = *(undefined8 *)((long)vn + 8);
  uVar1 = 0;
  while (uVar1 != 4) {
    uVar2 = *(uint *)((long)&local_28 + (uVar1 ^ 2) * 4) ^
            *(uint *)((long)&local_28 + (ulong)((uint)(uVar1 + 1) & 3) * 4) ^
            *(uint *)((long)&local_28 + (ulong)((int)uVar1 - 1U & 3) * 4) ^
            *(uint *)((long)&local_18 + uVar1 * 4);
    uVar3 = CONCAT13(sm4_sbox[uVar2 >> 0x18],
                     CONCAT12(sm4_sbox[uVar2 >> 0x10 & 0xff],
                              CONCAT11(sm4_sbox[uVar2 >> 8 & 0xff],sm4_sbox[uVar2 & 0xff])));
    *(uint *)((long)&local_28 + uVar1 * 4) =
         (uVar3 << 0x18 | uVar3 >> 8) ^
         (uVar3 << 0x12 | uVar3 >> 0xe) ^ (uVar3 << 2 | (uint)(sm4_sbox[uVar2 >> 0x18] >> 6)) ^
         uVar3 ^ (uVar3 << 10 | uVar3 >> 0x16) ^ *(uint *)((long)&local_28 + uVar1 * 4);
    uVar1 = uVar1 + 1;
  }
  *(undefined8 *)vd = local_28;
  *(undefined8 *)((long)vd + 8) = uStack_20;
  return;
}

Assistant:

void HELPER(crypto_sm4e)(void *vd, void *vn)
{
    uint64_t *rd = vd;
    uint64_t *rn = vn;
    union CRYPTO_STATE d = { .l = { rd[0], rd[1] } };
    union CRYPTO_STATE n = { .l = { rn[0], rn[1] } };
    uint32_t t, i;

    for (i = 0; i < 4; i++) {
        t = CR_ST_WORD(d, (i + 1) % 4) ^
            CR_ST_WORD(d, (i + 2) % 4) ^
            CR_ST_WORD(d, (i + 3) % 4) ^
            CR_ST_WORD(n, i);

        t = sm4_sbox[t & 0xff] |
            sm4_sbox[(t >> 8) & 0xff] << 8 |
            sm4_sbox[(t >> 16) & 0xff] << 16 |
            sm4_sbox[(t >> 24) & 0xff] << 24;

        CR_ST_WORD(d, i) ^= t ^ rol32(t, 2) ^ rol32(t, 10) ^ rol32(t, 18) ^
                            rol32(t, 24);
    }

    rd[0] = d.l[0];
    rd[1] = d.l[1];
}